

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O0

uint32_t address_space_lduw_x86_64
                   (uc_struct_conflict *uc,AddressSpace *as,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result)

{
  uint32_t uVar1;
  MemTxResult *result_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  uc_struct_conflict *uc_local;
  MemTxAttrs attrs_local;
  
  uVar1 = address_space_lduw_internal_x86_64(uc,as,addr,attrs,result,DEVICE_NATIVE_ENDIAN);
  return uVar1;
}

Assistant:

uint32_t glue(address_space_lduw, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result)
{
    return glue(address_space_lduw_internal, SUFFIX)(uc, ARG1, addr, attrs, result,
                                                     DEVICE_NATIVE_ENDIAN);
}